

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_DoublingFactorCounterTest_AllTerminalsAndHornors_SevenPairs_TestShell::
TEST_DoublingFactorCounterTest_AllTerminalsAndHornors_SevenPairs_TestShell
          (TEST_DoublingFactorCounterTest_AllTerminalsAndHornors_SevenPairs_TestShell *this)

{
  TEST_DoublingFactorCounterTest_AllTerminalsAndHornors_SevenPairs_TestShell *this_local;
  
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell =
       (_func_int **)
       &PTR__TEST_DoublingFactorCounterTest_AllTerminalsAndHornors_SevenPairs_TestShell_002554d0;
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, AllTerminalsAndHornors_SevenPairs)
{
	addPair(Tile::OneOfCharacters);
	addPair(Tile::NineOfCharacters);
	addPair(Tile::OneOfCircles);
	addPair(Tile::NineOfCircles);
	addPair(Tile::NineOfBamboos);
	addPair(Tile::WhiteDragon);
	addPair(Tile::WestWind);

	s.winByDiscard();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::AllTerminalsAndHornors));
	CHECK_EQUAL(1, r.patterns.count(Pattern::SevenPairs));
	CHECK_EQUAL(0, r.patterns.count(Pattern::TerminalOrHonorInEachSet));
	CHECK_EQUAL(4, r.doubling_factor);
}